

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
interfaces::MakeSignalHandler(interfaces *this,connection connection)

{
  undefined8 *puVar1;
  long in_FS_OFFSET;
  connection cStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (undefined8 *)operator_new(0x18);
  boost::signals2::connection::connection
            (&cStack_38,(connection *)connection._weak_connection_body.px);
  *puVar1 = &PTR__SignalHandler_00a29640;
  boost::signals2::connection::connection((connection *)(puVar1 + 1),&cStack_38);
  boost::detail::weak_count::~weak_count(&cStack_38._weak_connection_body.pn);
  *(undefined8 **)this = puVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> MakeSignalHandler(boost::signals2::connection connection)
{
    return std::make_unique<common::SignalHandler>(std::move(connection));
}